

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# servak.cpp
# Opt level: O2

string * hex2bin(string *__return_storage_ptr__,string *s)

{
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __first;
  string extract;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  std::__cxx11::string::reserve((ulong)__return_storage_ptr__);
  extract._M_dataplus._M_p = (pointer)&extract.field_2;
  extract._M_string_length = 0;
  extract.field_2._M_local_buf[0] = '\0';
  __first._M_current = (s->_M_dataplus)._M_p;
  while (__first._M_current < (s->_M_dataplus)._M_p + s->_M_string_length) {
    std::__cxx11::string::
    assign<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,void>
              ((string *)&extract,__first,
               (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                )(__first._M_current + 2));
    std::__cxx11::stoi(&extract,(size_t *)0x0,0x10);
    std::__cxx11::string::push_back((char)__return_storage_ptr__);
    __first._M_current = __first._M_current + 2;
  }
  std::__cxx11::string::~string((string *)&extract);
  return __return_storage_ptr__;
}

Assistant:

std::string hex2bin(std::string s) {
//    std::cout<<"String to dehash: "<<s<<std::endl;
//    if(s.length()&1) - no need at all as we know that s is bin2hex string
//        s = "0"+s;

    std::string sOut;
    sOut.reserve(s.length()/2);

    std::string extract;
    for (std::string::const_iterator pos = s.begin(); pos<s.end(); pos += 2)
    {
        extract.assign(pos, pos+2);
        sOut.push_back(std::stoi(extract, nullptr, 16));
    }
    return sOut;
}